

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

void __thiscall
Minisat::Solver::simpleAnalyze
          (Solver *this,CRef confl,vec<Minisat::Lit> *out_learnt,vec<unsigned_int> *reason_clause,
          bool True_confl)

{
  Lit p_00;
  bool bVar1;
  int iVar2;
  Lit *pLVar3;
  Lit *pLVar4;
  char *pcVar5;
  undefined1 in_DL;
  undefined7 in_register_00000011;
  CRef in_ESI;
  long in_RDI;
  byte in_R8B;
  Lit q;
  int j;
  Lit tmp;
  Clause *c;
  int index;
  Lit p;
  int pathC;
  undefined4 in_stack_ffffffffffffff38;
  Ref in_stack_ffffffffffffff3c;
  Solver *in_stack_ffffffffffffff40;
  Solver *in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  bool local_81;
  uint local_50;
  lbool local_45;
  int local_44;
  lbool local_3d;
  undefined4 local_3c;
  Clause *local_38;
  int local_30;
  Lit local_2c;
  int local_28;
  byte local_21;
  undefined8 local_18;
  CRef local_c;
  
  local_18 = CONCAT71(in_register_00000011,in_DL);
  local_21 = in_R8B & 1;
  local_28 = 0;
  local_2c.x = -2;
  local_c = in_ESI;
  local_30 = vec<Minisat::Lit>::size((vec<Minisat::Lit> *)(in_RDI + 0x350));
  local_30 = local_30 + -1;
  while( true ) {
    if (local_c == 0xffffffff) {
      in_stack_ffffffffffffff50 = local_18;
      operator~(local_2c);
      vec<Minisat::Lit>::push
                ((vec<Minisat::Lit> *)in_stack_ffffffffffffff40,
                 (Lit *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    }
    else {
      vec<unsigned_int>::push
                ((vec<unsigned_int> *)in_stack_ffffffffffffff40,
                 (uint *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      local_38 = ClauseAllocator::operator[]
                           ((ClauseAllocator *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
      local_3c = 0xfffffffe;
      bVar1 = Lit::operator!=(&local_2c,(Lit)0xfffffffe);
      local_81 = false;
      if (bVar1) {
        iVar2 = Clause::size(local_38);
        local_81 = false;
        if (iVar2 == 2) {
          pLVar4 = Clause::operator[](local_38,0);
          local_44 = pLVar4->x;
          local_3d = value(in_stack_ffffffffffffff48,(Lit)(int)in_stack_ffffffffffffff50);
          lbool::lbool(&local_45,'\x01');
          local_81 = lbool::operator==(&local_3d,local_45);
        }
      }
      if (local_81 != false) {
        pLVar4 = Clause::operator[](local_38,0);
        iVar2 = pLVar4->x;
        pLVar4 = Clause::operator[](local_38,1);
        pLVar3 = Clause::operator[](local_38,0);
        pLVar3->x = pLVar4->x;
        pLVar4 = Clause::operator[](local_38,1);
        pLVar4->x = iVar2;
      }
      bVar1 = Lit::operator==(&local_2c,(Lit)0xfffffffe);
      for (local_50 = (uint)(!bVar1 || (local_21 & 1) != 0); iVar2 = Clause::size(local_38),
          (int)local_50 < iVar2; local_50 = local_50 + 1) {
        pLVar4 = Clause::operator[](local_38,local_50);
        p_00.x = pLVar4->x;
        iVar2 = var(p_00);
        pcVar5 = vec<char>::operator[]((vec<char> *)(in_RDI + 0x570),iVar2);
        if (*pcVar5 == '\0') {
          var(p_00);
          iVar2 = level(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
          if (0 < iVar2) {
            iVar2 = var(p_00);
            pcVar5 = vec<char>::operator[]((vec<char> *)(in_RDI + 0x570),iVar2);
            *pcVar5 = '\x01';
            local_28 = local_28 + 1;
          }
        }
      }
    }
    if (local_28 == 0) break;
    do {
      iVar2 = local_30;
      in_stack_ffffffffffffff48 = (Solver *)(in_RDI + 0x570);
      local_30 = local_30 + -1;
      pLVar4 = vec<Minisat::Lit>::operator[]((vec<Minisat::Lit> *)(in_RDI + 0x350),iVar2);
      iVar2 = var((Lit)pLVar4->x);
      pcVar5 = vec<char>::operator[]((vec<char> *)in_stack_ffffffffffffff48,iVar2);
    } while (*pcVar5 == '\0');
    if (local_30 + 1 < *(int *)(in_RDI + 0x698)) {
      return;
    }
    pLVar4 = vec<Minisat::Lit>::operator[]((vec<Minisat::Lit> *)(in_RDI + 0x350),local_30 + 1);
    local_2c.x = pLVar4->x;
    var(local_2c);
    local_c = reason(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
    in_stack_ffffffffffffff40 = (Solver *)(in_RDI + 0x570);
    iVar2 = var(local_2c);
    pcVar5 = vec<char>::operator[]((vec<char> *)in_stack_ffffffffffffff40,iVar2);
    *pcVar5 = '\0';
    local_28 = local_28 + -1;
    if (local_28 < 0) {
      return;
    }
  }
  return;
}

Assistant:

void Solver::simpleAnalyze(CRef confl, vec<Lit> &out_learnt, vec<CRef> &reason_clause, bool True_confl)
{
    int pathC = 0;
    Lit p = lit_Undef;
    int index = trail.size() - 1;

    do {
        if (confl != CRef_Undef) {
            reason_clause.push(confl);
            Clause &c = ca[confl];
            // Special case for binary clauses
            // The first one has to be SAT
            if (p != lit_Undef && c.size() == 2 && value(c[0]) == l_False) {

                assert(value(c[1]) == l_True);
                Lit tmp = c[0];
                c[0] = c[1], c[1] = tmp;
            }
            // if True_confl==true, then choose p begin with the 1th index of c;
            for (int j = (p == lit_Undef && True_confl == false) ? 0 : 1; j < c.size(); j++) {
                Lit q = c[j];
                if (!seen[var(q)] && level(var(q)) > 0) { /* we will not touch level 0 variables */
                    seen[var(q)] = 1;
                    pathC++;
                }
            }
        } else if (confl == CRef_Undef) {
            out_learnt.push(~p);
        }
        // if not break, while() will come to the index of trail blow 0, and fatal error occur;
        if (pathC == 0) break;
        // Select next clause to look at:
        while (!seen[var(trail[index--])])
            ;
        // if the reason cr from the 0-level assigned var, we must break avoid move forth further;
        // but attention that maybe seen[x]=1 and never be clear. However makes no matter;
        if (trailRecord > index + 1) break;
        p = trail[index + 1];
        confl = reason(var(p));
        seen[var(p)] = 0;
        pathC--;

    } while (pathC >= 0);
}